

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpTests::init(ShaderAtomicOpTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *pTVar2;
  ShaderAtomicOpTests *pSVar3;
  deUint32 dVar4;
  int extraout_EAX;
  long *plVar5;
  char *pcVar6;
  ShaderAtomicOpCase *pSVar7;
  TestNode *pTVar8;
  size_type *psVar9;
  long *plVar10;
  DataType DVar11;
  int iVar12;
  Precision PVar13;
  bool bVar14;
  allocator<char> local_b1;
  string caseName;
  undefined1 local_90 [8];
  long local_88;
  long local_80;
  long lStack_78;
  TestNode *local_70;
  AtomicOperandType local_64;
  Context *local_60;
  long *local_58 [2];
  long local_48 [2];
  ShaderAtomicOpTests *local_38;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_64 = this->m_operandType;
  local_38 = this;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"add",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar7 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar7,local_60,caseName._M_dataplus._M_p,"atomicAdd",local_64,DVar11,PVar13,
                 (UVec3 *)local_90);
      (pSVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_021a9620;
      pSVar7->m_initialValue = 1;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"min",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar7 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar7,local_60,caseName._M_dataplus._M_p,"atomicMin",local_64,DVar11,PVar13,
                 (UVec3 *)local_90);
      (pSVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_021a9680;
      dVar4 = 1000;
      if (pSVar7->m_precision == PRECISION_LOWP) {
        dVar4 = 100;
      }
      pSVar7->m_initialValue = dVar4;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"max",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar7 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar7,local_60,caseName._M_dataplus._M_p,"atomicMax",local_64,DVar11,PVar13,
                 (UVec3 *)local_90);
      (pSVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_021a96e0;
      dVar4 = 0xfffffc18;
      if (pSVar7->m_precision == PRECISION_LOWP) {
        dVar4 = 0xffffff9c;
      }
      if (pSVar7->m_type != TYPE_INT) {
        dVar4 = 0;
      }
      pSVar7->m_initialValue = dVar4;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_60 = (Context *)CONCAT44(local_60._4_4_,pSVar3->m_operandType);
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  plVar5 = (long *)std::__cxx11::string::append(local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"and",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append(local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pTVar8 = (TestNode *)operator_new(200);
      ShaderAtomicAndCase::ShaderAtomicAndCase
                ((ShaderAtomicAndCase *)pTVar8,pCVar1,caseName._M_dataplus._M_p,
                 (AtomicOperandType)local_60,DVar11,PVar13);
      tcu::TestNode::addChild(local_70,pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_70,pTVar2,"or",caseName._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar7 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar7,local_60,caseName._M_dataplus._M_p,"atomicOr",local_64,DVar11,PVar13,
                 (UVec3 *)local_90);
      (pSVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_021a97a0;
      pSVar7->m_initialValue = 1;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"xor",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar7 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar7,local_60,caseName._M_dataplus._M_p,"atomicXor",local_64,DVar11,PVar13,
                 (UVec3 *)local_90);
      (pSVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_021a9800;
      pSVar7->m_initialValue = 0;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"exchange",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar7 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar7,local_60,caseName._M_dataplus._M_p,"atomicExchange",local_64,DVar11,PVar13,
                 (UVec3 *)local_90);
      (pSVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_021a9860;
      pSVar7->m_initialValue = 0;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_60 = (Context *)CONCAT44(local_60._4_4_,pSVar3->m_operandType);
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  plVar5 = (long *)std::__cxx11::string::append(local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName.field_2._8_8_ = plVar5[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar9;
    caseName._M_dataplus._M_p = (pointer)*plVar5;
  }
  caseName._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"compswap",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar13 = PRECISION_LOWP;
  do {
    iVar12 = 1;
    do {
      bVar14 = iVar12 != 0;
      iVar12 = iVar12 + -1;
      pcVar6 = glu::getPrecisionName(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar6,&local_b1);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar5[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar5;
      }
      DVar11 = (uint)bVar14 * 4 + TYPE_INT;
      local_88 = plVar5[1];
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      glu::getDataTypeName(DVar11);
      plVar5 = (long *)std::__cxx11::string::append(local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName.field_2._8_8_ = plVar5[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar9;
        caseName._M_dataplus._M_p = (pointer)*plVar5;
      }
      caseName._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pTVar8 = (TestNode *)operator_new(0xa8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar8,pCVar1->m_testCtx,caseName._M_dataplus._M_p,
                 "atomicCompSwap() Test");
      pTVar8[1]._vptr_TestNode = (_func_int **)pCVar1;
      pTVar8->_vptr_TestNode = (_func_int **)&PTR__ShaderAtomicCompSwapCase_021a9568;
      *(AtomicOperandType *)&pTVar8[1].m_testCtx = (AtomicOperandType)local_60;
      *(DataType *)((long)&pTVar8[1].m_testCtx + 4) = DVar11;
      *(Precision *)&pTVar8[1].m_name._M_dataplus._M_p = PVar13;
      *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x200000003;
      *(undefined8 *)((long)&pTVar8[1].m_name._M_string_length + 4) = 0x400000001;
      *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 4) = 0x400000004;
      pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x0;
      tcu::TestNode::addChild(local_70,pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
    } while (iVar12 == 0);
    PVar13 = PVar13 + PRECISION_MEDIUMP;
  } while (PVar13 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  return extraout_EAX;
}

Assistant:

void ShaderAtomicOpTests::init (void)
{
	addChild(createAtomicOpGroup<ShaderAtomicAddCase>		(m_context, m_operandType, "add"));
	addChild(createAtomicOpGroup<ShaderAtomicMinCase>		(m_context, m_operandType, "min"));
	addChild(createAtomicOpGroup<ShaderAtomicMaxCase>		(m_context, m_operandType, "max"));
	addChild(createAtomicOpGroup<ShaderAtomicAndCase>		(m_context, m_operandType, "and"));
	addChild(createAtomicOpGroup<ShaderAtomicOrCase>		(m_context, m_operandType, "or"));
	addChild(createAtomicOpGroup<ShaderAtomicXorCase>		(m_context, m_operandType, "xor"));
	addChild(createAtomicOpGroup<ShaderAtomicExchangeCase>	(m_context, m_operandType, "exchange"));
	addChild(createAtomicOpGroup<ShaderAtomicCompSwapCase>	(m_context, m_operandType, "compswap"));
}